

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

void __thiscall
FxFRandom::FxFRandom
          (FxFRandom *this,FRandom *r,FxExpression *mi,FxExpression *ma,FScriptPosition *pos)

{
  FxExpression *pFVar1;
  
  FxExpression::FxExpression((FxExpression *)this,pos);
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_00867b40;
  (this->super_FxRandom).super_FxExpression.field_0x31 = 0;
  (this->super_FxRandom).min = (FxExpression *)0x0;
  (this->super_FxRandom).max = (FxExpression *)0x0;
  (this->super_FxRandom).rng = r;
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)TypeSInt32;
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_00867be0;
  if (ma != (FxExpression *)0x0 && mi != (FxExpression *)0x0) {
    pFVar1 = (FxExpression *)operator_new(0x40);
    FxExpression::FxExpression(pFVar1,&mi->ScriptPosition);
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_00867500;
    pFVar1[1]._vptr_FxExpression = (_func_int **)mi;
    pFVar1->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).min = pFVar1;
    pFVar1 = (FxExpression *)operator_new(0x40);
    FxExpression::FxExpression(pFVar1,&ma->ScriptPosition);
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_00867500;
    pFVar1[1]._vptr_FxExpression = (_func_int **)ma;
    pFVar1->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).max = pFVar1;
  }
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)TypeFloat64;
  return;
}

Assistant:

FxFRandom::FxFRandom(FRandom *r, FxExpression *mi, FxExpression *ma, const FScriptPosition &pos)
: FxRandom(r, NULL, NULL, pos)
{
	if (mi != NULL && ma != NULL)
	{
		min = new FxFloatCast(mi);
		max = new FxFloatCast(ma);
	}
	ValueType = TypeFloat64;
}